

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.cpp
# Opt level: O1

int __thiscall
helics::ipc::SendToQueue::connect(SendToQueue *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  __single_object __ptr;
  _Alloc_hider _Var5;
  char *pcVar6;
  size_type sVar7;
  int iVar8;
  queue_state_t qVar9;
  int iVar10;
  __uniq_ptr_data<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>,_true,_true>
  mapping;
  int *piVar11;
  managed_open_or_create_impl<boost::interprocess::shared_memory_object,0ul,true,false> *__p_00;
  int iVar12;
  pointer __p;
  size_type sVar13;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  mapped_region region;
  char local_d8;
  __single_object queue_state;
  string stateName;
  char *local_88;
  size_type local_80;
  char local_78;
  undefined7 uStack_77;
  undefined8 uStack_70;
  string *local_68;
  pointer local_60;
  timespec local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(in_register_00000034,__fd);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &this->connectionNameOrig,__str);
  pcVar2 = (__str->_M_dataplus)._M_p;
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + __str->_M_string_length);
  sVar7 = local_80;
  pcVar6 = local_88;
  if (local_80 != 0) {
    sVar13 = 0;
    do {
      iVar12 = (int)pcVar6[sVar13];
      iVar8 = isalnum(iVar12);
      if ((iVar12 != 0x5f) && (iVar8 == 0)) {
        pcVar6[sVar13] = '_';
      }
      sVar13 = sVar13 + 1;
    } while (sVar7 != sVar13);
  }
  stateName._M_string_length = local_80;
  paVar1 = &stateName.field_2;
  if (local_88 == &local_78) {
    stateName.field_2._8_8_ = uStack_70;
    stateName._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    stateName._M_dataplus._M_p = local_88;
  }
  stateName.field_2._M_allocated_capacity._1_7_ = uStack_77;
  stateName.field_2._M_local_buf[0] = local_78;
  local_80 = 0;
  local_78 = '\0';
  local_68 = &this->connectionName;
  local_88 = &local_78;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stateName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)stateName._M_dataplus._M_p != paVar1) {
    operator_delete(stateName._M_dataplus._M_p,stateName.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  pcVar3 = (this->connectionName)._M_dataplus._M_p;
  stateName._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stateName,pcVar3,pcVar3 + (this->connectionName)._M_string_length);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stateName,
             "_state");
  iVar8 = 0;
  bVar4 = false;
  do {
    _Var5._M_p = stateName._M_dataplus._M_p;
    mapping.
    super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
    ._M_t.
    super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
    .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>._M_head_impl =
         (__uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
          )operator_new(0x28);
    boost::interprocess::shared_memory_object::shared_memory_object
              ((shared_memory_object *)
               mapping.
               super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
               ._M_t.
               super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
               .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>.
               _M_head_impl,_Var5._M_p,2);
    queue_state._M_t.
    super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
    ._M_t.
    super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
    .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>._M_head_impl =
         (__uniq_ptr_data<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>,_true,_true>
          )(__uniq_ptr_data<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>,_true,_true>
            )mapping.
             super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
             ._M_t.
             super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
             .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>._M_head_impl
    ;
    boost::interprocess::mapped_region::mapped_region<boost::interprocess::shared_memory_object>
              (&region,(shared_memory_object *)
                       mapping.
                       super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
                       .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>.
                       _M_head_impl,read_write,0,0,(void *)0x0,-1);
    qVar9 = SharedQueueState::getState((SharedQueueState *)region.m_base);
    __ptr = queue_state;
    if ((uint)qVar9 < 2) {
      bVar4 = true;
    }
    else if ((qVar9 == operating) && (local_d8 = (char)__addr, local_d8 == '\0')) {
      bVar4 = true;
    }
    __p_00 = (managed_open_or_create_impl<boost::interprocess::shared_memory_object,0ul,true,false>
              *)CONCAT71(mapping.
                         super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
                         .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>.
                         _M_head_impl._1_7_,1);
    if (!bVar4) {
      iVar12 = iVar8 + 1;
      if (iVar8 < (int)__len) {
        queue_state._M_t.
        super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
        ._M_t.
        super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
        .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>._M_head_impl =
             (__uniq_ptr_data<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>,_true,_true>
              )(__uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
                )0x0;
        if ((__uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
             )__ptr._M_t.
              super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
              ._M_t.
              super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
              .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>.
              _M_head_impl !=
            (__uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
             )0x0) {
          std::default_delete<boost::interprocess::shared_memory_object>::operator()
                    ((default_delete<boost::interprocess::shared_memory_object> *)&queue_state,
                     (shared_memory_object *)
                     __ptr._M_t.
                     super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
                     .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>.
                     _M_head_impl);
        }
        local_58.tv_sec = 0;
        local_58.tv_nsec = 200000000;
        do {
          iVar10 = nanosleep(&local_58,&local_58);
          iVar8 = iVar12;
          if (iVar10 != -1) break;
          piVar11 = __errno_location();
        } while (*piVar11 == 4);
      }
      else {
        __p_00 = (managed_open_or_create_impl<boost::interprocess::shared_memory_object,0ul,true,false>
                  *)0x0;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &this->errorString,0,(this->errorString)._M_string_length,
                   "timed out waiting for the queue to become available",0x33);
        iVar8 = iVar12;
      }
    }
    if (region.m_base != (void *)0x0) {
      if (region.m_is_xsi == true) {
        shmdt(region.m_base);
      }
      else {
        munmap((void *)((long)region.m_base - region.m_page_offset),
               region.m_page_offset + region.m_size);
        region.m_base = (void *)0x0;
      }
    }
    if ((__uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
         )queue_state._M_t.
          super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
          ._M_t.
          super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
          .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
         )0x0) {
      std::default_delete<boost::interprocess::shared_memory_object>::operator()
                ((default_delete<boost::interprocess::shared_memory_object> *)&queue_state,
                 (shared_memory_object *)
                 queue_state._M_t.
                 super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
                 .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>.
                 _M_head_impl);
    }
    if ((char)__p_00 == '\0') {
      iVar8 = 0;
      goto LAB_00161ad8;
    }
    if (bVar4) {
      if (this->connected == false) {
        do {
          pcVar3 = (local_68->_M_dataplus)._M_p;
          __p_00 = (managed_open_or_create_impl<boost::interprocess::shared_memory_object,0ul,true,false>
                    *)operator_new(0x20);
          local_48 = 0;
          uStack_40 = 0;
          local_60 = pcVar3;
          boost::interprocess::ipcdetail::
          managed_open_or_create_impl<boost::interprocess::shared_memory_object,0ul,true,false>::
          managed_open_or_create_impl<boost::interprocess::ipcdetail::msg_queue_initialization_func_t<boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>>>
                    (__p_00,&local_60,2,0,&local_48);
          region.m_base = (void *)0x0;
          std::
          __uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
          ::reset((__uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                   *)this,(pointer)__p_00);
          std::
          unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
          ::~unique_ptr((unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                         *)&region);
          this->connected = true;
        } while (this->connected == false);
      }
      iVar8 = (int)CONCAT71((int7)((ulong)__p_00 >> 8),this->connected);
LAB_00161ad8:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)stateName._M_dataplus._M_p != &stateName.field_2) {
        operator_delete(stateName._M_dataplus._M_p,stateName.field_2._M_allocated_capacity + 1);
      }
      return iVar8;
    }
  } while( true );
}

Assistant:

bool SendToQueue::connect(const std::string& connection, bool initOnly, int retries)
    {
        connectionNameOrig = connection;
        connectionName = stringTranslateToCppName(connection);
        std::string stateName = connectionName + "_state";
        bool goodToConnect = false;
        int tries = 0;
        while (!goodToConnect) {
            try {
                auto queue_state = std::make_unique<ipc_state>(boostipc::open_only,
                                                               stateName.c_str(),
                                                               boostipc::read_write);
                boostipc::mapped_region region(*queue_state, boostipc::read_write);

                auto* sstate = reinterpret_cast<SharedQueueState*>(region.get_address());

                switch (sstate->getState()) {
                    case queue_state_t::connected:
                    case queue_state_t::startup:
                        goodToConnect = true;
                        break;
                    case queue_state_t::operating:
                        if (!initOnly) {
                            goodToConnect = true;
                        }
                        break;
                    case queue_state_t::unknown:  // probably still undergoing setup
                    default:
                        break;
                }
                if (!goodToConnect) {
                    ++tries;
                    if (tries <= retries) {
                        queue_state.reset();
                        std::this_thread::sleep_for(std::chrono::milliseconds(200));
                    } else {
                        errorString = "timed out waiting for the queue to become available";
                        return false;
                    }
                }
            }

            catch (boost::interprocess::interprocess_exception const&) {
                // this likely means the shared_memory_object doesn't exist yet
                ++tries;
                if (tries <= retries) {
                    std::this_thread::sleep_for(std::chrono::milliseconds(200));
                } else {
                    errorString = "timed out waiting for the queue to become available";
                    return false;
                }
            }
        }

        while (!connected) {
            try {
                txqueue = std::make_unique<ipc_queue>(boostipc::open_only, connectionName.c_str());
                connected = true;
            }
            catch (boost::interprocess::interprocess_exception const& ipe) {
                // this likely means the shared file doesn't exist yet
                ++tries;
                if (tries <= retries) {
                    std::this_thread::sleep_for(std::chrono::milliseconds(200));
                } else {
                    errorString = std::string("Unable to open connection:") + ipe.what();
                    break;
                }
            }
        }
        return connected;
    }